

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O2

void __thiscall
leveldb::anon_unknown_1::PosixWritableFile::PosixWritableFile
          (PosixWritableFile *this,string *filename,int fd)

{
  string *this_00;
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  long in_FS_OFFSET;
  Slice local_48;
  Slice local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_WritableFile)._vptr_WritableFile = (_func_int **)&PTR__PosixWritableFile_00a28f70;
  this->pos_ = 0;
  this->fd_ = fd;
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
                    (filename,'/',0xffffffffffffffff);
  if (sVar2 == 0xffffffffffffffff) {
    local_38.data_ = (filename->_M_dataplus)._M_p;
    local_38.size_ = filename->_M_string_length;
  }
  else {
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (filename,'/',sVar2 + 1);
    if (sVar3 != 0xffffffffffffffff) {
      __assert_fail("filename.find(\'/\', separator_pos + 1) == std::string::npos",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/util/env_posix.cc"
                    ,0x1ad,
                    "static Slice leveldb::(anonymous namespace)::PosixWritableFile::Basename(const std::string &)"
                   );
    }
    local_38.data_ = (filename->_M_dataplus)._M_p + sVar2 + 1;
    local_38.size_ = ~sVar2 + filename->_M_string_length;
  }
  local_48.data_ = "MANIFEST";
  local_48.size_ = 8;
  bVar1 = Slice::starts_with(&local_38,&local_48);
  this->is_manifest_ = bVar1;
  this_00 = &this->filename_;
  std::__cxx11::string::string((string *)this_00,filename);
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
                    (this_00,'/',0xffffffffffffffff);
  if (sVar2 == 0xffffffffffffffff) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&this->dirname_,".",(allocator<char> *)&local_38);
  }
  else {
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (this_00,'/',sVar2 + 1);
    if (sVar3 != 0xffffffffffffffff) {
      __assert_fail("filename.find(\'/\', separator_pos + 1) == std::string::npos",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/util/env_posix.cc"
                    ,0x19d,
                    "static std::string leveldb::(anonymous namespace)::PosixWritableFile::Dirname(const std::string &)"
                   );
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&this->dirname_,this_00,0,sVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

PosixWritableFile(std::string filename, int fd)
      : pos_(0),
        fd_(fd),
        is_manifest_(IsManifest(filename)),
        filename_(std::move(filename)),
        dirname_(Dirname(filename_)) {}